

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# separator.cpp
# Opt level: O2

void __thiscall ftxui::SeparatorWithPixel::Render(SeparatorWithPixel *this,Screen *screen)

{
  Pixel *this_00;
  int y;
  int x;
  
  for (y = (this->super_Separator).super_Node.box_.y_min;
      y <= (this->super_Separator).super_Node.box_.y_max; y = y + 1) {
    for (x = (this->super_Separator).super_Node.box_.x_min;
        x <= (this->super_Separator).super_Node.box_.x_max; x = x + 1) {
      this_00 = Screen::PixelAt(screen,x,y);
      Pixel::operator=(this_00,&this->pixel_);
    }
  }
  return;
}

Assistant:

void Render(Screen& screen) override {
    for (int y = box_.y_min; y <= box_.y_max; ++y) {
      for (int x = box_.x_min; x <= box_.x_max; ++x) {
        screen.PixelAt(x, y) = pixel_;
      }
    }
  }